

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O1

cmList * __thiscall
cmList::transform(cmList *this,TransformAction action,
                 unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
                 *selector)

{
  TransformSelector *pTVar1;
  iterator descriptor;
  _Base_ptr *local_38;
  undefined8 uStack_30;
  code *local_28;
  code *pcStack_20;
  _Base_ptr local_18;
  
  local_18 = (_Base_ptr)anon_unknown.dwarf_156cac::TransformConfigure(action,selector,0);
  local_38 = &local_18;
  (local_18[2]._M_left)->_M_parent =
       (_Base_ptr)
       (selector->_M_t).
       super___uniq_ptr_impl<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
       ._M_t.
       super__Tuple_impl<0UL,_cmList::TransformSelector_*,_std::default_delete<cmList::TransformSelector>_>
       .super__Head_base<0UL,_cmList::TransformSelector_*,_false>._M_head_impl;
  pTVar1 = (selector->_M_t).
           super___uniq_ptr_impl<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmList::TransformSelector_*,_std::default_delete<cmList::TransformSelector>_>
           .super__Head_base<0UL,_cmList::TransformSelector_*,_false>._M_head_impl;
  uStack_30 = 0;
  pcStack_20 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmList.cxx:749:19)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmList.cxx:749:19)>
             ::_M_manager;
  (*pTVar1->_vptr_TransformSelector[5])(pTVar1,this);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  return this;
}

Assistant:

cmList& cmList::transform(TransformAction action,
                          std::unique_ptr<TransformSelector> selector)
{
  auto descriptor = TransformConfigure(action, selector, 0);

  descriptor->Transform->Initialize(
    static_cast<::TransformSelector*>(selector.get()));

  static_cast<::TransformSelector&>(*selector).Transform(
    this->Values, [&descriptor](const std::string& s) -> std::string {
      return (*descriptor->Transform)(s);
    });

  return *this;
}